

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::AllocaInstr::clone
          (AllocaInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Value *local_30;
  LiteralType local_24;
  unique_ptr<flow::AllocaInstr,_std::default_delete<flow::AllocaInstr>_> local_20 [2];
  AllocaInstr *this_local;
  
  local_20[1]._M_t.super___uniq_ptr_impl<flow::AllocaInstr,_std::default_delete<flow::AllocaInstr>_>
  ._M_t.super__Tuple_impl<0UL,_flow::AllocaInstr_*,_std::default_delete<flow::AllocaInstr>_>.
  super__Head_base<0UL,_flow::AllocaInstr_*,_false>._M_head_impl =
       (__uniq_ptr_data<flow::AllocaInstr,_std::default_delete<flow::AllocaInstr>,_true,_true>)
       (__uniq_ptr_data<flow::AllocaInstr,_std::default_delete<flow::AllocaInstr>,_true,_true>)__fn;
  this_local = this;
  local_24 = Value::type((Value *)__fn);
  local_30 = Instr::operand((Instr *)__fn,0);
  Value::name_abi_cxx11_((Value *)__fn);
  std::make_unique<flow::AllocaInstr,flow::LiteralType,flow::Value*,std::__cxx11::string_const&>
            ((LiteralType *)local_20,(Value **)&local_24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::AllocaInstr,std::default_delete<flow::AllocaInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,local_20);
  std::unique_ptr<flow::AllocaInstr,_std::default_delete<flow::AllocaInstr>_>::~unique_ptr(local_20)
  ;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> AllocaInstr::clone() {
  return std::make_unique<AllocaInstr>(type(), operand(0), name());
}